

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_linearization.cc
# Opt level: O1

void load_vector_int<QPDF::HPageOffsetEntry,int>
               (BitStream *bit_stream,int nitems,
               vector<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_> *vec,
               int bits_wanted,offset_in_HPageOffsetEntry_to_int field)

{
  pointer pHVar1;
  pointer pHVar2;
  pointer pHVar3;
  int iVar4;
  logic_error *this;
  ulong uVar5;
  type ii;
  type ii_1;
  ulong uVar6;
  HPageOffsetEntry local_88;
  
  pHVar1 = (vec->super__Vector_base<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pHVar2 = (vec->super__Vector_base<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  uVar6 = 0;
  while( true ) {
    if (nitems < 0) {
      QIntC::IntConverter<int,_unsigned_long,_true,_false>::error(nitems);
    }
    if ((long)nitems == uVar6) {
      uVar6 = ((long)(vec->
                     super__Vector_base<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_>
                     )._M_impl.super__Vector_impl_data._M_finish -
               (long)(vec->
                     super__Vector_base<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_>
                     )._M_impl.super__Vector_impl_data._M_start >> 3) * 0x2e8ba2e8ba2e8ba3;
      if ((uVar6 & 0xffffffff80000000) != 0) {
        QIntC::IntConverter<unsigned_long,_int,_false,_true>::error(uVar6);
      }
      if ((int)uVar6 == nitems) {
        BitStream::skipToNextByte(bit_stream);
        return;
      }
      this = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(this,"vector has wrong size in load_vector_int");
      __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    if (pHVar1 == pHVar2) {
      local_88.shared_numerators.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_88.delta_content_offset = 0;
      local_88.shared_numerators.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_88.shared_numerators.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_88.shared_identifiers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_88.shared_identifiers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_88.nshared_objects = 0;
      local_88._20_4_ = 0;
      local_88.shared_identifiers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_88.delta_nobjects = 0;
      local_88._4_4_ = 0;
      local_88.delta_page_length = 0;
      local_88.delta_content_length = 0;
      std::vector<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_>::
      emplace_back<QPDF::HPageOffsetEntry>(vec,&local_88);
      if (local_88.shared_numerators.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_88.shared_numerators.super__Vector_base<int,_std::allocator<int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_88.shared_numerators.
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_88.shared_numerators.
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_88.shared_identifiers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_88.shared_identifiers.super__Vector_base<int,_std::allocator<int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_88.shared_identifiers.
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_88.shared_identifiers.
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
    }
    if (bits_wanted < 0) {
      QIntC::IntConverter<int,_unsigned_long,_true,_false>::error(bits_wanted);
    }
    iVar4 = BitStream::getBitsInt(bit_stream,(long)bits_wanted);
    pHVar3 = (vec->
             super__Vector_base<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_>).
             _M_impl.super__Vector_impl_data._M_start;
    uVar5 = ((long)(vec->
                   super__Vector_base<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_>
                   )._M_impl.super__Vector_impl_data._M_finish - (long)pHVar3 >> 3) *
            0x2e8ba2e8ba2e8ba3;
    if (uVar5 < uVar6 || uVar5 - uVar6 == 0) break;
    *(int *)((long)&pHVar3->delta_nobjects + field) = iVar4;
    uVar6 = uVar6 + 1;
    field = field + 0x58;
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar6);
}

Assistant:

static void
load_vector_int(
    BitStream& bit_stream, int nitems, std::vector<T>& vec, int bits_wanted, int_type T::* field)
{
    bool append = vec.empty();
    // nitems times, read bits_wanted from the given bit stream, storing results in the ith vector
    // entry.

    for (size_t i = 0; i < QIntC::to_size(nitems); ++i) {
        if (append) {
            vec.push_back(T());
        }
        vec.at(i).*field = bit_stream.getBitsInt(QIntC::to_size(bits_wanted));
    }
    if (QIntC::to_int(vec.size()) != nitems) {
        throw std::logic_error("vector has wrong size in load_vector_int");
    }
    // The PDF spec says that each hint table starts at a byte boundary.  Each "row" actually must
    // start on a byte boundary.
    bit_stream.skipToNextByte();
}